

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moneystr.cpp
# Opt level: O3

string * FormatMoney_abi_cxx11_(string *__return_storage_ptr__,CAmount n)

{
  int iVar1;
  pointer pcVar2;
  int iVar3;
  int iVar4;
  long *in_R8;
  long in_FS_OFFSET;
  int64_t remainder;
  int64_t quotient;
  long local_28;
  long local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = n / 100000000;
  local_28 = n % 100000000;
  if (n < 0) {
    local_20 = -local_20;
    local_28 = -local_28;
  }
  tinyformat::format<long,long>
            (__return_storage_ptr__,(tinyformat *)0x2554fa,(char *)&local_20,&local_28,in_R8);
  pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
  iVar4 = (int)__return_storage_ptr__->_M_string_length;
  if (pcVar2[iVar4 + -1] == '0') {
    iVar4 = iVar4 + -3;
    iVar3 = 0;
    do {
      if (9 < (byte)(pcVar2[iVar4] - 0x30U)) {
        if (iVar3 == 0) goto LAB_001c029f;
        break;
      }
      iVar1 = iVar4 + 1;
      iVar4 = iVar4 + -1;
      iVar3 = iVar3 + -1;
    } while (pcVar2[iVar1] == '0');
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (__return_storage_ptr__,__return_storage_ptr__->_M_string_length - (ulong)(uint)-iVar3
               ,(ulong)(uint)-iVar3);
  }
LAB_001c029f:
  if (n < 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
              (__return_storage_ptr__,0,1,'-');
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FormatMoney(const CAmount n)
{
    // Note: not using straight sprintf here because we do NOT want
    // localized number formatting.
    static_assert(COIN > 1);
    int64_t quotient = n / COIN;
    int64_t remainder = n % COIN;
    if (n < 0) {
        quotient = -quotient;
        remainder = -remainder;
    }
    std::string str = strprintf("%d.%08d", quotient, remainder);

    // Right-trim excess zeros before the decimal point:
    int nTrim = 0;
    for (int i = str.size()-1; (str[i] == '0' && IsDigit(str[i-2])); --i)
        ++nTrim;
    if (nTrim)
        str.erase(str.size()-nTrim, nTrim);

    if (n < 0)
        str.insert(uint32_t{0}, 1, '-');
    return str;
}